

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::SetArgs(cmake *this,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args,bool directoriesSetBefore)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  long lVar6;
  const_reference pvVar7;
  char *pcVar8;
  ulong uVar9;
  ostream *poVar10;
  bool collapse;
  bool collapse_00;
  allocator local_211;
  string local_210;
  char *local_1f0;
  char *connectionString;
  string local_1c8;
  cmGlobalGenerator *local_1a8;
  cmGlobalGenerator *gen;
  string value_2;
  string value_1;
  string local_158 [8];
  string value;
  string file;
  string connection;
  undefined1 local_d8 [8];
  string path_2;
  undefined1 local_98 [8];
  string path_1;
  string local_68;
  undefined1 local_48 [8];
  string path;
  string *arg;
  uint i;
  bool havePlatform;
  bool haveToolset;
  bool directoriesSet;
  bool directoriesSetBefore_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  bVar3 = false;
  bVar1 = false;
  arg._0_4_ = 1;
  arg._6_1_ = directoriesSetBefore;
  do {
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar5 <= (uint)arg) {
      if ((arg._6_1_ & 1) == 0) {
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  (&local_1c8,(SystemTools *)0x1,collapse);
        SetHomeOutputDirectory(this,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                  ((string *)&connectionString,(SystemTools *)0x1,collapse_00);
        SetHomeDirectory(this,(string *)&connectionString);
        std::__cxx11::string::~string((string *)&connectionString);
      }
      pcVar8 = getenv("CMAKE_DEBUGGER");
      if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
        local_1f0 = pcVar8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_210,pcVar8,&local_211);
        SetupDebugger(this,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
      }
      return;
    }
    path.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](args,(ulong)(uint)arg);
    lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa1edb7);
    if (lVar6 == 0) {
      arg._6_1_ = 1;
      std::__cxx11::string::substr((ulong)local_48,path.field_2._8_8_);
      cmsys::SystemTools::CollapseFullPath(&local_68,(string *)local_48);
      std::__cxx11::string::operator=((string *)local_48,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_48);
      SetHomeDirectory(this,(string *)local_48);
      std::__cxx11::string::~string((string *)local_48);
    }
    else {
      lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa10d74);
      if ((lVar6 != 0) &&
         (lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa10d77), lVar6 != 0)) {
        lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa1edbb);
        if (lVar6 == 0) {
          arg._6_1_ = 1;
          std::__cxx11::string::substr((ulong)local_98,path.field_2._8_8_);
          cmsys::SystemTools::CollapseFullPath
                    ((string *)((long)&path_2.field_2 + 8),(string *)local_98);
          std::__cxx11::string::operator=
                    ((string *)local_98,(string *)(path_2.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(path_2.field_2._M_local_buf + 8));
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_98);
          SetHomeOutputDirectory(this,(string *)local_98);
          std::__cxx11::string::~string((string *)local_98);
        }
        else {
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          if (((ulong)(uint)arg < sVar5 - 2) &&
             (lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa10d7a), lVar6 == 0))
          {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)((uint)arg + 1));
            std::__cxx11::string::operator=
                      ((string *)&this->CheckBuildSystemArgument,(string *)pvVar7);
            arg._0_4_ = (uint)arg + 2;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](args,(ulong)(uint)arg);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            iVar4 = atoi(pcVar8);
            this->ClearBuildSystem = 0 < iVar4;
          }
          else {
            sVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if (((ulong)(uint)arg < sVar5 - 1) &&
               (lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa10d8f), lVar6 == 0)
               ) {
              arg._0_4_ = (uint)arg + 1;
              pvVar7 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)(uint)arg);
              std::__cxx11::string::operator=((string *)&this->CheckStampFile,(string *)pvVar7);
            }
            else {
              sVar5 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(args);
              if (((ulong)(uint)arg < sVar5 - 1) &&
                 (lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa10da2),
                 lVar6 == 0)) {
                arg._0_4_ = (uint)arg + 1;
                pvVar7 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,(ulong)(uint)arg);
                std::__cxx11::string::operator=((string *)&this->CheckStampList,(string *)pvVar7);
              }
              else {
                lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa076a1);
                if ((lVar6 != 0) &&
                   ((lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa10c2b),
                    lVar6 != 0 &&
                    (lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa05b82),
                    lVar6 != 0)))) {
                  lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa05e6d);
                  if (lVar6 == 0) {
                    arg._0_4_ = (uint)arg + 1;
                  }
                  else {
                    lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa10cb0);
                    if (lVar6 == 0) {
                      arg._0_4_ = (uint)arg + 1;
                    }
                    else {
                      lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa10bdd);
                      if (lVar6 != 0) {
                        lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa10db5);
                        if (lVar6 == 0) {
                          std::__cxx11::string::substr((ulong)local_d8,path.field_2._8_8_);
                          cmsys::SystemTools::CollapseFullPath
                                    ((string *)((long)&connection.field_2 + 8),(string *)local_d8);
                          std::__cxx11::string::operator=
                                    ((string *)local_d8,
                                     (string *)(connection.field_2._M_local_buf + 8));
                          std::__cxx11::string::~string
                                    ((string *)(connection.field_2._M_local_buf + 8));
                          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_d8);
                          std::__cxx11::string::operator=
                                    ((string *)&this->GraphVizFile,(string *)local_d8);
                          uVar9 = std::__cxx11::string::empty();
                          if ((uVar9 & 1) != 0) {
                            cmSystemTools::Error
                                      ("No file specified for --graphviz",(char *)0x0,(char *)0x0,
                                       (char *)0x0);
                          }
                          std::__cxx11::string::~string((string *)local_d8);
                        }
                        else {
                          lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa10de2);
                          if (lVar6 == 0) {
                            std::__cxx11::string::substr
                                      ((ulong)(&file.field_2._M_allocated_capacity + 1),
                                       path.field_2._8_8_);
                            SetupDebugger(this,(string *)(&file.field_2._M_allocated_capacity + 1));
                            std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8))
                            ;
                          }
                          else {
                            lVar6 = std::__cxx11::string::find((char *)path.field_2._8_8_,0xa10dee);
                            if (lVar6 == 0) {
                              std::operator<<((ostream *)&std::cout,"debug trycompile on\n");
                              DebugTryCompileOn(this);
                            }
                            else {
                              lVar6 = std::__cxx11::string::find
                                                ((char *)path.field_2._8_8_,0xa10e16);
                              if (lVar6 == 0) {
                                std::operator<<((ostream *)&std::cout,
                                                "Running with debug output on.\n");
                                SetDebugOutputOn(this,true);
                              }
                              else {
                                lVar6 = std::__cxx11::string::find
                                                  ((char *)path.field_2._8_8_,0xa10e44);
                                if (lVar6 == 0) {
                                  std::operator<<((ostream *)&std::cout,
                                                  "Running with expanded trace output on.\n");
                                  SetTrace(this,true);
                                  SetTraceExpand(this,true);
                                }
                                else {
                                  lVar6 = std::__cxx11::string::find
                                                    ((char *)path.field_2._8_8_,0xa10e7b);
                                  if (lVar6 == 0) {
                                    std::__cxx11::string::substr
                                              ((ulong)(&value.field_2._M_allocated_capacity + 1),
                                               path.field_2._8_8_);
                                    cmsys::SystemTools::ConvertToUnixSlashes
                                              ((string *)(&value.field_2._M_allocated_capacity + 1))
                                    ;
                                    AddTraceSource(this,(string *)((long)&value.field_2 + 8));
                                    SetTrace(this,true);
                                    std::__cxx11::string::~string
                                              ((string *)(value.field_2._M_local_buf + 8));
                                  }
                                  else {
                                    lVar6 = std::__cxx11::string::find
                                                      ((char *)path.field_2._8_8_,0xa10e8b);
                                    if (lVar6 == 0) {
                                      std::operator<<((ostream *)&std::cout,
                                                      "Running with trace output on.\n");
                                      SetTrace(this,true);
                                      SetTraceExpand(this,false);
                                    }
                                    else {
                                      lVar6 = std::__cxx11::string::find
                                                        ((char *)path.field_2._8_8_,0xa10eb2);
                                      if (lVar6 == 0) {
                                        std::operator<<((ostream *)&std::cout,
                                                        "Warn about uninitialized values.\n");
                                        SetWarnUninitialized(this,true);
                                      }
                                      else {
                                        lVar6 = std::__cxx11::string::find
                                                          ((char *)path.field_2._8_8_,0xa10ee9);
                                        if (lVar6 == 0) {
                                          std::operator<<((ostream *)&std::cout,
                                                          "Finding unused variables.\n");
                                          SetWarnUnused(this,true);
                                        }
                                        else {
                                          lVar6 = std::__cxx11::string::find
                                                            ((char *)path.field_2._8_8_,0xa10f17);
                                          if (lVar6 == 0) {
                                            poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                                            
                                                  "Not searching for unused variables given on the "
                                                  );
                                            std::operator<<(poVar10,"command line.\n");
                                            SetWarnUnusedCli(this,false);
                                          }
                                          else {
                                            lVar6 = std::__cxx11::string::find
                                                              ((char *)path.field_2._8_8_,0xa10f6c);
                                            if (lVar6 == 0) {
                                              poVar10 = std::operator<<((ostream *)&std::cout,
                                                                                                                                                
                                                  "Also check system files when warning about unused and "
                                                  );
                                              std::operator<<(poVar10,"uninitialized variables.\n");
                                              SetCheckSystemVars(this,true);
                                            }
                                            else {
                                              lVar6 = std::__cxx11::string::find
                                                                ((char *)path.field_2._8_8_,0xa10feb
                                                                );
                                              if (lVar6 == 0) {
                                                std::__cxx11::string::substr
                                                          ((ulong)local_158,path.field_2._8_8_);
                                                uVar9 = std::__cxx11::string::empty();
                                                if ((uVar9 & 1) == 0) {
LAB_0061713d:
                                                  if (bVar1) {
                                                    cmSystemTools::Error
                                                              ("Multiple -A options not allowed",
                                                               (char *)0x0,(char *)0x0,(char *)0x0);
                                                    bVar2 = true;
                                                  }
                                                  else {
                                                    std::__cxx11::string::operator=
                                                              ((string *)&this->GeneratorPlatform,
                                                               local_158);
                                                    bVar1 = true;
                                                    bVar2 = false;
                                                  }
                                                }
                                                else {
                                                  arg._0_4_ = (uint)arg + 1;
                                                  sVar5 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  if ((uint)arg < sVar5) {
                                                    pvVar7 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,(ulong)(uint)arg);
                                                  std::__cxx11::string::operator=
                                                            (local_158,(string *)pvVar7);
                                                  goto LAB_0061713d;
                                                  }
                                                  cmSystemTools::Error
                                                            ("No platform specified for -A",
                                                             (char *)0x0,(char *)0x0,(char *)0x0);
                                                  bVar2 = true;
                                                }
                                                std::__cxx11::string::~string(local_158);
                                                if (bVar2) {
                                                  return;
                                                }
                                              }
                                              else {
                                                lVar6 = std::__cxx11::string::find
                                                                  ((char *)path.field_2._8_8_,
                                                                   0xa11027);
                                                if (lVar6 != 0) {
                                                  lVar6 = std::__cxx11::string::find
                                                                    ((char *)path.field_2._8_8_,
                                                                     0xa11065);
                                                  if (lVar6 != 0) {
                                                    arg._6_1_ = 1;
                                                    pcVar8 = (char *)std::__cxx11::string::c_str();
                                                    SetDirectoriesFromFile(this,pcVar8);
                                                    goto LAB_006174ea;
                                                  }
                                                  std::__cxx11::string::substr
                                                            ((ulong)&gen,path.field_2._8_8_);
                                                  uVar9 = std::__cxx11::string::empty();
                                                  if ((uVar9 & 1) == 0) {
LAB_006173f2:
                                                    local_1a8 = CreateGlobalGenerator
                                                                          (this,(string *)&gen);
                                                    if (local_1a8 == (cmGlobalGenerator *)0x0) {
                                                      pcVar8 = (char *)std::__cxx11::string::c_str()
                                                      ;
                                                      cmSystemTools::Error
                                                                ("Could not create named generator "
                                                                 ,pcVar8,(char *)0x0,(char *)0x0);
                                                      PrintGeneratorList(this);
                                                    }
                                                    else {
                                                      SetGlobalGenerator(this,local_1a8);
                                                    }
                                                    bVar2 = false;
                                                  }
                                                  else {
                                                    arg._0_4_ = (uint)arg + 1;
                                                    sVar5 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  if ((uint)arg < sVar5) {
                                                    pvVar7 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,(ulong)(uint)arg);
                                                  std::__cxx11::string::operator=
                                                            ((string *)&gen,(string *)pvVar7);
                                                  goto LAB_006173f2;
                                                  }
                                                  cmSystemTools::Error
                                                            ("No generator specified for -G",
                                                             (char *)0x0,(char *)0x0,(char *)0x0);
                                                  PrintGeneratorList(this);
                                                  bVar2 = true;
                                                  }
                                                  std::__cxx11::string::~string((string *)&gen);
                                                  if (bVar2) {
                                                    return;
                                                  }
                                                  goto LAB_006174ea;
                                                }
                                                std::__cxx11::string::substr
                                                          ((ulong)((long)&value_2.field_2 + 8),
                                                           path.field_2._8_8_);
                                                uVar9 = std::__cxx11::string::empty();
                                                if ((uVar9 & 1) == 0) {
LAB_0061728f:
                                                  if (bVar3) {
                                                    cmSystemTools::Error
                                                              ("Multiple -T options not allowed",
                                                               (char *)0x0,(char *)0x0,(char *)0x0);
                                                    bVar2 = true;
                                                  }
                                                  else {
                                                    std::__cxx11::string::operator=
                                                              ((string *)&this->GeneratorToolset,
                                                               (string *)
                                                               (value_2.field_2._M_local_buf + 8));
                                                    bVar3 = true;
                                                    bVar2 = false;
                                                  }
                                                }
                                                else {
                                                  arg._0_4_ = (uint)arg + 1;
                                                  sVar5 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  if ((uint)arg < sVar5) {
                                                    pvVar7 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,(ulong)(uint)arg);
                                                  std::__cxx11::string::operator=
                                                            ((string *)
                                                             (value_2.field_2._M_local_buf + 8),
                                                             (string *)pvVar7);
                                                  goto LAB_0061728f;
                                                  }
                                                  cmSystemTools::Error
                                                            ("No toolset specified for -T",
                                                             (char *)0x0,(char *)0x0,(char *)0x0);
                                                  bVar2 = true;
                                                }
                                                std::__cxx11::string::~string
                                                          ((string *)
                                                           (value_2.field_2._M_local_buf + 8));
                                                if (bVar2) {
                                                  return;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_006174ea:
    arg._0_4_ = (uint)arg + 1;
  } while( true );
}

Assistant:

void cmake::SetArgs(const std::vector<std::string>& args,
                    bool directoriesSetBefore)
{
  bool directoriesSet = directoriesSetBefore;
  bool haveToolset = false;
  bool havePlatform = false;
  for (unsigned int i = 1; i < args.size(); ++i) {
    std::string const& arg = args[i];
    if (arg.find("-H", 0) == 0) {
      directoriesSet = true;
      std::string path = arg.substr(2);
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeDirectory(path);
    } else if (arg.find("-S", 0) == 0) {
      // There is no local generate anymore.  Ignore -S option.
    } else if (arg.find("-O", 0) == 0) {
      // There is no local generate anymore.  Ignore -O option.
    } else if (arg.find("-B", 0) == 0) {
      directoriesSet = true;
      std::string path = arg.substr(2);
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->SetHomeOutputDirectory(path);
    } else if ((i < args.size() - 2) &&
               (arg.find("--check-build-system", 0) == 0)) {
      this->CheckBuildSystemArgument = args[++i];
      this->ClearBuildSystem = (atoi(args[++i].c_str()) > 0);
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-file", 0) == 0)) {
      this->CheckStampFile = args[++i];
    } else if ((i < args.size() - 1) &&
               (arg.find("--check-stamp-list", 0) == 0)) {
      this->CheckStampList = args[++i];
    }
#if defined(CMAKE_HAVE_VS_GENERATORS)
    else if ((i < args.size() - 1) &&
             (arg.find("--vs-solution-file", 0) == 0)) {
      this->VSSolutionFile = args[++i];
    }
#endif
    else if (arg.find("-D", 0) == 0) {
      // skip for now
    } else if (arg.find("-U", 0) == 0) {
      // skip for now
    } else if (arg.find("-C", 0) == 0) {
      // skip for now
    } else if (arg.find("-P", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("--find-package", 0) == 0) {
      // skip for now
      i++;
    } else if (arg.find("-W", 0) == 0) {
      // skip for now
    } else if (arg.find("--graphviz=", 0) == 0) {
      std::string path = arg.substr(strlen("--graphviz="));
      path = cmSystemTools::CollapseFullPath(path);
      cmSystemTools::ConvertToUnixSlashes(path);
      this->GraphVizFile = path;
      if (this->GraphVizFile.empty()) {
        cmSystemTools::Error("No file specified for --graphviz");
      }
#if defined(HAVE_DEBUG_SERVER)
    } else if (arg.find("--debugger=", 0) == 0) {
      std::string connection = arg.substr(strlen("--debugger="));
      SetupDebugger(connection);
#endif
    } else if (arg.find("--debug-trycompile", 0) == 0) {
      std::cout << "debug trycompile on\n";
      this->DebugTryCompileOn();
    } else if (arg.find("--debug-output", 0) == 0) {
      std::cout << "Running with debug output on.\n";
      this->SetDebugOutputOn(true);
    } else if (arg.find("--trace-expand", 0) == 0) {
      std::cout << "Running with expanded trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(true);
    } else if (arg.find("--trace-source=", 0) == 0) {
      std::string file = arg.substr(strlen("--trace-source="));
      cmSystemTools::ConvertToUnixSlashes(file);
      this->AddTraceSource(file);
      this->SetTrace(true);
    } else if (arg.find("--trace", 0) == 0) {
      std::cout << "Running with trace output on.\n";
      this->SetTrace(true);
      this->SetTraceExpand(false);
    } else if (arg.find("--warn-uninitialized", 0) == 0) {
      std::cout << "Warn about uninitialized values.\n";
      this->SetWarnUninitialized(true);
    } else if (arg.find("--warn-unused-vars", 0) == 0) {
      std::cout << "Finding unused variables.\n";
      this->SetWarnUnused(true);
    } else if (arg.find("--no-warn-unused-cli", 0) == 0) {
      std::cout << "Not searching for unused variables given on the "
                << "command line.\n";
      this->SetWarnUnusedCli(false);
    } else if (arg.find("--check-system-vars", 0) == 0) {
      std::cout << "Also check system files when warning about unused and "
                << "uninitialized variables.\n";
      this->SetCheckSystemVars(true);
    } else if (arg.find("-A", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No platform specified for -A");
          return;
        }
        value = args[i];
      }
      if (havePlatform) {
        cmSystemTools::Error("Multiple -A options not allowed");
        return;
      }
      this->GeneratorPlatform = value;
      havePlatform = true;
    } else if (arg.find("-T", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No toolset specified for -T");
          return;
        }
        value = args[i];
      }
      if (haveToolset) {
        cmSystemTools::Error("Multiple -T options not allowed");
        return;
      }
      this->GeneratorToolset = value;
      haveToolset = true;
    } else if (arg.find("-G", 0) == 0) {
      std::string value = arg.substr(2);
      if (value.empty()) {
        ++i;
        if (i >= args.size()) {
          cmSystemTools::Error("No generator specified for -G");
          this->PrintGeneratorList();
          return;
        }
        value = args[i];
      }
      cmGlobalGenerator* gen = this->CreateGlobalGenerator(value);
      if (!gen) {
        cmSystemTools::Error("Could not create named generator ",
                             value.c_str());
        this->PrintGeneratorList();
      } else {
        this->SetGlobalGenerator(gen);
      }
    }
    // no option assume it is the path to the source
    else {
      directoriesSet = true;
      this->SetDirectoriesFromFile(arg.c_str());
    }
  }